

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void SetRPCWarmupFinished(void)

{
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock7;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = (mutex_type *)&g_rpc_warmup_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  if (fRPCInWarmup == '\x01') {
    __assert_fail("fRPCInWarmup",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
                  ,0x15a,"void SetRPCWarmupFinished()");
  }
  fRPCInWarmup = 1;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetRPCWarmupFinished()
{
    LOCK(g_rpc_warmup_mutex);
    assert(fRPCInWarmup);
    fRPCInWarmup = false;
}